

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

string * __thiscall
sqlite::Connection::Stmt::get_col<std::__cxx11::string>
          (string *__return_storage_ptr__,Stmt *this,int column)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = (char *)sqlite3_column_text(this->stmt_,column);
  if (pcVar1 == (char *)0x0) {
    s_abi_cxx11_(__return_storage_ptr__,"",0);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Connection::Stmt::get_col<std::string>(const int column)
    {
        const char * str = reinterpret_cast<const char *>(sqlite3_column_text(stmt_, column));

        if(!str)
            return ""s; // empty str for NULL data
        else
            return std::string(str);
    }